

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O0

BOOL __thiscall Js::JavascriptString::GetItemAt(JavascriptString *this,charcount_t index,Var *value)

{
  bool bVar1;
  char16 c;
  JavascriptLibrary *this_00;
  CharStringCache *this_01;
  JavascriptString *pJVar2;
  char16 character;
  Var *value_local;
  charcount_t index_local;
  JavascriptString *this_local;
  
  bVar1 = IsValidIndexValue(this,index);
  if (bVar1) {
    c = GetItem(this,index);
    this_00 = RecyclableObject::GetLibrary(&this->super_RecyclableObject);
    this_01 = JavascriptLibrary::GetCharStringCache(this_00);
    pJVar2 = CharStringCache::GetStringForChar(this_01,c);
    *value = pJVar2;
  }
  this_local._4_4_ = (uint)bVar1;
  return this_local._4_4_;
}

Assistant:

BOOL JavascriptString::GetItemAt(charcount_t index, Var* value)
    {
        if (!IsValidIndexValue(index))
        {
            return false;
        }

        char16 character = GetItem(index);

        *value = this->GetLibrary()->GetCharStringCache().GetStringForChar(character);

        return true;
    }